

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O2

BigInteger * __thiscall rapidjson::internal::BigInteger::operator*=(BigInteger *this,uint32_t u)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  Type digit;
  ulong uVar4;
  
  if (u != 1) {
    if (u == 0) {
      this->digits_[0] = 0;
    }
    else {
      uVar3 = this->count_;
      uVar1 = (ulong)u;
      if ((uVar3 != 1) || (this->digits_[0] != 1)) {
        digit = 0;
        for (uVar2 = 0; uVar2 < uVar3; uVar2 = uVar2 + 1) {
          uVar4 = (this->digits_[uVar2] & 0xffffffff) * uVar1 + digit;
          uVar3 = (uVar4 >> 0x20) + (this->digits_[uVar2] >> 0x20) * uVar1;
          this->digits_[uVar2] = uVar3 << 0x20 | uVar4 & 0xffffffff;
          digit = uVar3 >> 0x20;
          uVar3 = this->count_;
        }
        if (digit == 0) {
          return this;
        }
        PushBack(this,digit);
        return this;
      }
      this->digits_[0] = uVar1;
    }
    this->count_ = 1;
  }
  return this;
}

Assistant:

BigInteger& operator*=(uint32_t u) {
        if (u == 0) return *this = 0;
        if (u == 1) return *this;
        if (*this == 1) return *this = u;

        uint64_t k = 0;
        for (size_t i = 0; i < count_; i++) {
            const uint64_t c = digits_[i] >> 32;
            const uint64_t d = digits_[i] & 0xFFFFFFFF;
            const uint64_t uc = u * c;
            const uint64_t ud = u * d;
            const uint64_t p0 = ud + k;
            const uint64_t p1 = uc + (p0 >> 32);
            digits_[i] = (p0 & 0xFFFFFFFF) | (p1 << 32);
            k = p1 >> 32;
        }
        
        if (k > 0)
            PushBack(k);

        return *this;
    }